

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Pubkey * __thiscall
cfd::core::Privkey::GeneratePubkey(Pubkey *__return_storage_ptr__,Privkey *this,bool is_compressed)

{
  int iVar1;
  uchar *puVar2;
  size_t priv_key_len;
  uchar *puVar3;
  size_type sVar4;
  undefined8 uVar5;
  CfdException *this_00;
  string *in_stack_fffffffffffffde0;
  size_type in_stack_fffffffffffffde8;
  CfdError CVar6;
  CfdException *in_stack_fffffffffffffdf0;
  ByteData local_198;
  undefined1 local_17a;
  allocator local_179;
  string local_178 [32];
  ByteData local_158;
  string local_140;
  CfdSourceLocation local_120;
  undefined1 local_100 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressed_pubkey;
  ByteData local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  string local_a0;
  CfdSourceLocation local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  int local_50 [2];
  int ret;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  bool is_compressed_local;
  Privkey *this_local;
  
  pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = is_compressed;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x472fc6);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8,(allocator_type *)in_stack_fffffffffffffde0);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x472fe6);
  ByteData::GetBytes(&local_68,&this->data_);
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x473001);
  priv_key_len = ByteData::GetDataSize(&this->data_);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x47302d);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  iVar1 = wally_ec_public_key_from_private_key(puVar2,priv_key_len,puVar3,sVar4);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0);
  local_50[0] = iVar1;
  if (iVar1 != 0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
                 ,0x2f);
    CVar6 = (CfdError)(in_stack_fffffffffffffde8 >> 0x20);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x332;
    local_80.funcname = "GeneratePubkey";
    ByteData::GetHex_abi_cxx11_(&local_a0,&this->data_);
    logger::warn<int&,std::__cxx11::string>
              (&local_80,"wally_ec_public_key_from_private_key error. ret={} privkey={}.",local_50,
               &local_a0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    local_c2 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_c0,"Generate Pubkey error.",&local_c1);
    CfdException::CfdException(in_stack_fffffffffffffdf0,CVar6,in_stack_fffffffffffffde0);
    local_c2 = 0;
    __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x473298);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffde8,(allocator_type *)in_stack_fffffffffffffde0);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4732be);
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4732ce);
    this_00 = (CfdException *)
              ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    in_stack_fffffffffffffde0 = (string *)local_100;
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4732fb);
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffde0);
    local_50[0] = wally_ec_public_key_decompress(puVar2,(size_t)this_00,puVar3,sVar4);
    CVar6 = (CfdError)((ulong)puVar2 >> 0x20);
    if (local_50[0] != 0) {
      local_120.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
                   ,0x2f);
      local_120.filename = local_120.filename + 1;
      local_120.line = 0x342;
      local_120.funcname = "GeneratePubkey";
      ByteData::ByteData(&local_158,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
      ByteData::GetHex_abi_cxx11_(&local_140,&local_158);
      logger::warn<int&,std::__cxx11::string>
                (&local_120,"wally_ec_public_key_decompress error. ret={} compressed pubkey={}.",
                 local_50,&local_140);
      ::std::__cxx11::string::~string((string *)&local_140);
      ByteData::~ByteData((ByteData *)0x4733d8);
      local_17a = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_178,"Decompressed Pubkey error.",&local_179);
      CfdException::CfdException(this_00,CVar6,in_stack_fffffffffffffde0);
      local_17a = 0;
      __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData(&local_198,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100
                      );
    Pubkey::Pubkey(__return_storage_ptr__,&local_198);
    ByteData::~ByteData((ByteData *)0x473545);
    uncompressed_pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0);
  }
  else {
    ByteData::ByteData(&local_e0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    Pubkey::Pubkey(__return_storage_ptr__,&local_e0);
    ByteData::~ByteData((ByteData *)0x473259);
    uncompressed_pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0);
  return __return_storage_ptr__;
}

Assistant:

Pubkey Privkey::GeneratePubkey(bool is_compressed) const {
  std::vector<uint8_t> pubkey(Pubkey::kCompressedPubkeySize);
  int ret = wally_ec_public_key_from_private_key(
      data_.GetBytes().data(), data_.GetDataSize(), pubkey.data(),
      pubkey.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE,
        "wally_ec_public_key_from_private_key error. ret={} privkey={}.", ret,
        data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Generate Pubkey error.");
  }
  if (is_compressed) {
    return Pubkey(pubkey);
  }

  std::vector<uint8_t> uncompressed_pubkey(Pubkey::kPubkeySize);
  ret = wally_ec_public_key_decompress(
      pubkey.data(), pubkey.size(), uncompressed_pubkey.data(),
      uncompressed_pubkey.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE,
        "wally_ec_public_key_decompress error. ret={} compressed pubkey={}.",
        ret, ByteData(pubkey).GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Decompressed Pubkey error.");
  }
  return Pubkey(uncompressed_pubkey);
}